

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* duckdb::HivePartitioning::Parse
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,string *filename)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string value;
  string key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (filename->_M_string_length != 0) {
    bVar4 = 1;
    uVar5 = 0;
    uVar7 = 0;
    uVar6 = 0;
    do {
      cVar2 = (filename->_M_dataplus)._M_p[uVar6];
      if ((cVar2 == '?') || (cVar2 == '\n')) {
        bVar4 = 0;
      }
      if (cVar2 == '\\') {
LAB_01409c67:
        if ((bool)(bVar4 & uVar5 < uVar7)) {
          ::std::__cxx11::string::substr((ulong)&local_90,(ulong)filename);
          ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)filename);
          local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
          if (local_90 == &local_80) {
            local_70.first.field_2._8_8_ = local_80._8_8_;
          }
          else {
            local_70.first._M_dataplus._M_p = (pointer)local_90;
          }
          local_70.first.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
          local_70.first.field_2._M_local_buf[0] = local_80._M_local_buf[0];
          local_70.first._M_string_length = local_88;
          local_88 = 0;
          local_80._M_local_buf[0] = '\0';
          local_70.second._M_dataplus._M_p = (pointer)&local_70.second.field_2;
          if (local_b0 == &local_a0) {
            local_70.second.field_2._8_8_ = local_a0._8_8_;
          }
          else {
            local_70.second._M_dataplus._M_p = (pointer)local_b0;
          }
          local_70.second.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_
          ;
          local_70.second.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
          local_70.second._M_string_length = local_a8;
          local_a8 = 0;
          local_a0._M_local_buf[0] = '\0';
          local_b0 = &local_a0;
          local_90 = &local_80;
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
            operator_delete(local_70.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
            operator_delete(local_70.first._M_dataplus._M_p);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
        }
        uVar5 = uVar6 + 1;
        bVar4 = 1;
      }
      else if (cVar2 == '=') {
        bVar3 = uVar5 < uVar7;
        uVar7 = uVar6;
        if (bVar3) {
          bVar4 = 0;
        }
      }
      else if (cVar2 == '/') goto LAB_01409c67;
      uVar6 = uVar6 + 1;
    } while (uVar6 < filename->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<string, string> HivePartitioning::Parse(const string &filename) {
	idx_t partition_start = 0;
	idx_t equality_sign = 0;
	bool candidate_partition = true;
	std::map<string, string> result;
	for (idx_t c = 0; c < filename.size(); c++) {
		if (filename[c] == '?' || filename[c] == '\n') {
			// get parameter or newline - not a partition
			candidate_partition = false;
		}
		if (filename[c] == '\\' || filename[c] == '/') {
			// separator
			if (candidate_partition && equality_sign > partition_start) {
				// we found a partition with an equality sign
				string key = filename.substr(partition_start, equality_sign - partition_start);
				string value = filename.substr(equality_sign + 1, c - equality_sign - 1);
				result.insert(make_pair(std::move(key), std::move(value)));
			}
			partition_start = c + 1;
			candidate_partition = true;
		} else if (filename[c] == '=') {
			if (equality_sign > partition_start) {
				// multiple equality signs - not a partition
				candidate_partition = false;
			}
			equality_sign = c;
		}
	}
	return result;
}